

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_sync(rtr_socket *rtr_socket)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 auStack_10078 [4];
  int iStack_10074;
  pdu_type pStack_10070;
  undefined4 uStack_1006c;
  int iStack_10068;
  pdu_type pStack_10064;
  int rtval;
  pdu_type type;
  rtr_socket *prStack_10058;
  rtr_socket *rtr_socket_local;
  char cStack_10048;
  byte bStack_10047;
  int oldcancelstate;
  char pdu [65535];
  char txt [48];
  
  _rtval = auStack_10078;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prStack_10058 = rtr_socket;
  do {
    pthread_setcancelstate(0,(int *)((long)&rtr_socket_local + 4));
    iStack_10068 = rtr_receive_pdu(prStack_10058,&cStack_10048,0xffff,0x3c);
    pthread_setcancelstate(1,(int *)((long)&rtr_socket_local + 4));
    if (((iStack_10068 == -4) && ((prStack_10058->request_session_id & 1U) != 0)) &&
       (lrtr_dbg("RTR Socket: The cache server closed the connection and we have no session_id!"),
       prStack_10058->version != 0)) {
      lrtr_dbg("RTR Socket: Downgrading from %i to version %i",(ulong)prStack_10058->version,
               (ulong)(prStack_10058->version - 1));
      prStack_10058->version = prStack_10058->version - 1;
      rtr_change_socket_state(prStack_10058,RTR_FAST_RECONNECT);
      rtr_socket_local._0_4_ = -1;
      goto LAB_0010cb8e;
    }
    if (iStack_10068 == -2) {
      rtr_change_socket_state(prStack_10058,RTR_ERROR_TRANSPORT);
      rtr_socket_local._0_4_ = -1;
      goto LAB_0010cb8e;
    }
    if (iStack_10068 < 0) {
      rtr_socket_local._0_4_ = -1;
      goto LAB_0010cb8e;
    }
    pStack_10064 = rtr_get_pdu_type(&cStack_10048);
    if (pStack_10064 == SERIAL_NOTIFY) {
      lrtr_dbg("RTR Socket: Ignoring Serial Notify");
    }
  } while (pStack_10064 == SERIAL_NOTIFY);
  pStack_10070 = pStack_10064;
  if (pStack_10064 == CACHE_RESPONSE) {
    rtr_handle_cache_response_pdu(prStack_10058,&cStack_10048);
    iVar2 = rtr_sync_receive_and_store_pdus(prStack_10058);
    if (iVar2 == -1) {
      rtr_socket_local._0_4_ = -1;
    }
    else {
      prStack_10058->request_session_id = false;
      iVar2 = rtr_set_last_update(prStack_10058);
      if (iVar2 == -1) {
        rtr_socket_local._0_4_ = -1;
      }
      else {
        rtr_socket_local._0_4_ = 0;
      }
    }
  }
  else if (pStack_10064 == CACHE_RESET) {
    lrtr_dbg("RTR Socket: Cache Reset PDU received");
    rtr_change_socket_state(prStack_10058,RTR_ERROR_NO_INCR_UPDATE_AVAIL);
    rtr_socket_local._0_4_ = -1;
  }
  else if (pStack_10064 == ERROR) {
    rtr_handle_error_pdu(prStack_10058,&cStack_10048);
    rtr_socket_local._0_4_ = -1;
  }
  else {
    lrtr_dbg("RTR Socket: Expected Cache Response PDU but received PDU Type (Type: %u)",
             (ulong)bStack_10047);
    memcpy(pdu + 0xfff8,"Unexpected PDU received in data synchronisation",0x30);
    rtr_send_error_pdu_from_host(prStack_10058,&cStack_10048,8,CORRUPT_DATA,pdu + 0xfff8,0x30);
    rtr_socket_local._0_4_ = -1;
  }
LAB_0010cb8e:
  uStack_1006c = 1;
  iStack_10074 = (int)rtr_socket_local;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    *(undefined8 *)(_rtval + -8) = 0x10cbca;
    __stack_chk_fail();
  }
  return (int)rtr_socket_local;
}

Assistant:

int rtr_sync(struct rtr_socket *rtr_socket)
{
	char pdu[RTR_MAX_PDU_LEN];
	enum pdu_type type;

	int oldcancelstate;

	do {
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
		int rtval = rtr_receive_pdu(rtr_socket, pdu, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		// If the cache has closed the connection and we don't have a
		// session_id (no packages where exchanged) we should downgrade.
		if (rtval == TR_CLOSED && rtr_socket->request_session_id) {
			RTR_DBG1("The cache server closed the connection and we have no session_id!");
			if (rtr_socket->version > RTR_PROTOCOL_MIN_SUPPORTED_VERSION) {
				RTR_DBG("Downgrading from %i to version %i", rtr_socket->version,
					rtr_socket->version - 1);
				rtr_socket->version = rtr_socket->version - 1;
				rtr_change_socket_state(rtr_socket, RTR_FAST_RECONNECT);
				return RTR_ERROR;
			}
		}

		if (rtval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			return RTR_ERROR;
		} else if (rtval < 0) {
			return RTR_ERROR;
		}

		type = rtr_get_pdu_type(pdu);
		if (type == SERIAL_NOTIFY)
			RTR_DBG1("Ignoring Serial Notify");

	} while (type == SERIAL_NOTIFY);

	switch (type) {
	case ERROR:
		rtr_handle_error_pdu(rtr_socket, pdu);
		return RTR_ERROR;
	case CACHE_RESET:
		RTR_DBG1("Cache Reset PDU received");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_NO_INCR_UPDATE_AVAIL);
		return RTR_ERROR;
	case CACHE_RESPONSE:
		rtr_handle_cache_response_pdu(rtr_socket, pdu);
		break;
	default:
		RTR_DBG("Expected Cache Response PDU but received PDU Type (Type: %u)",
			((struct pdu_header *)pdu)->type);
		const char txt[] = "Unexpected PDU received in data synchronisation";

		rtr_send_error_pdu_from_host(rtr_socket, pdu, sizeof(struct pdu_header), CORRUPT_DATA, txt,
					     sizeof(txt));
		return RTR_ERROR;
	}

	// Receive all PDUs until EOD PDU
	if (rtr_sync_receive_and_store_pdus(rtr_socket) == RTR_ERROR)
		return RTR_ERROR;

	rtr_socket->request_session_id = false;
	if (rtr_set_last_update(rtr_socket) == RTR_ERROR)
		return RTR_ERROR;

	return RTR_SUCCESS;
}